

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulator.h
# Opt level: O2

XInputSimulator * XInputSimulator::getInstance(void)

{
  int iVar1;
  XInputSimulatorImplLinux *this;
  
  if (getInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&getInstance()::instance);
    if (iVar1 != 0) {
      __cxa_atexit(~XInputSimulator,&getInstance::instance,&__dso_handle);
      __cxa_guard_release(&getInstance()::instance);
    }
  }
  this = (XInputSimulatorImplLinux *)operator_new(0xf0);
  XInputSimulatorImplLinux::XInputSimulatorImplLinux(this);
  getInstance::instance.implementation = (XInputSimulatorImpl *)this;
  return &getInstance::instance;
}

Assistant:

static XInputSimulator & getInstance()
    {
        static XInputSimulator instance;

#ifdef __linux__
        instance.implementation = new XInputSimulatorImplLinux;
#elif __APPLE__
        instance.implementation = new XInputSimulatorImplMacOs;
#elif _WIN32
        instance.implementation = new XInputSimulatorImplWin;
#endif
        return instance;
    }